

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int tinyexr::DecodeTiledLevel
              (EXRImage *exr_image,EXRHeader *exr_header,OffsetData *offset_data,
              vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list,
              int pixel_data_size,uchar *head,size_t size,string *err)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int x_stride;
  int iVar5;
  int iVar6;
  int height;
  int compression_type;
  int line_order;
  pointer pvVar7;
  long *plVar8;
  long lVar9;
  int *requested_pixel_types;
  EXRAttribute *attributes;
  bool bVar10;
  int iVar11;
  int width;
  EXRTile *pEVar12;
  uchar **ppuVar13;
  ulong data_len;
  int iVar14;
  int num_lines;
  uint uVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  EXRChannelInfo *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int num_channels;
  
  if (exr_header->tile_level_mode == 2) {
    iVar11 = exr_image->level_y * offset_data->num_x_levels + exr_image->level_x;
  }
  else {
    iVar11 = 0;
    if (exr_header->tile_level_mode == 1) {
      iVar11 = exr_image->level_x;
    }
  }
  num_channels = exr_header->num_channels;
  pvVar7 = (offset_data->offsets).
           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  plVar8 = *(long **)&pvVar7[iVar11].
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl;
  iVar14 = (int)((ulong)(plVar8[1] - *plVar8) >> 3);
  uVar15 = (int)((ulong)((long)*(pointer *)
                                ((long)&pvVar7[iVar11].
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        ._M_impl + 8) - (long)plVar8) >> 3) * iVar14 * -0x55555555;
  pEVar12 = (EXRTile *)calloc(0x20,(long)(int)uVar15);
  exr_image->tiles = pEVar12;
  if ((int)uVar15 < 1) {
    uVar16 = 0;
  }
  else {
    lVar18 = 0;
    iVar17 = 0;
    uVar16 = 0;
    do {
      ppuVar13 = AllocateImage(num_channels,exr_header->channels,exr_header->requested_pixel_types,
                               exr_header->tile_size_x,exr_header->tile_size_y);
      *(uchar ***)((long)&exr_image->tiles->images + lVar18) = ppuVar13;
      lVar9 = *(long *)(*(long *)(*(long *)&(offset_data->offsets).
                                            super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[iVar11].
                                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                            ._M_impl + (long)(iVar17 / iVar14) * 0x18) +
                       ((long)iVar17 % (long)iVar14 & 0xffffffffU) * 8);
      if (size < lVar9 + 0x14U) {
        uVar16 = uVar16 | 2;
      }
      else {
        iVar1 = *(int *)(head + lVar9 + 8);
        if ((iVar1 == exr_image->level_x) &&
           (iVar2 = *(int *)(head + lVar9 + 0xc), iVar2 == exr_image->level_y)) {
          data_len = (ulong)*(int *)(head + lVar9 + 0x10);
          if (((long)data_len < 2) || (size - (lVar9 + 0x14U) < data_len)) {
            uVar16 = uVar16 | 2;
          }
          else {
            iVar3 = *(int *)(head + lVar9);
            iVar4 = *(int *)(head + lVar9 + 4);
            pEVar12 = exr_image->tiles;
            x_stride = exr_header->tile_size_x;
            iVar5 = exr_image->width;
            if (iVar5 < x_stride * iVar3) {
LAB_001cb2a2:
              uVar16 = uVar16 | 4;
            }
            else {
              iVar6 = exr_image->height;
              height = exr_header->tile_size_y;
              if (iVar6 < height * iVar4) goto LAB_001cb2a2;
              requested_pixel_types = exr_header->requested_pixel_types;
              compression_type = exr_header->compression_type;
              line_order = exr_header->line_order;
              width = iVar5 - x_stride * iVar3;
              if ((iVar3 + 1) * x_stride < iVar5) {
                width = x_stride;
              }
              iVar5 = exr_header->num_channels;
              attributes = (EXRAttribute *)exr_header->channels;
              *(int *)((long)&pEVar12->width + lVar18) = width;
              num_lines = iVar6 - height * iVar4;
              if ((iVar4 + 1) * height < iVar6) {
                num_lines = height;
              }
              *(int *)((long)&pEVar12->height + lVar18) = num_lines;
              bVar10 = DecodePixelData(*(uchar ***)((long)&pEVar12->images + lVar18),
                                       requested_pixel_types,head + lVar9 + 0x14,data_len,
                                       compression_type,line_order,width,height,x_stride,0,0,
                                       num_lines,(long)pixel_data_size,(long)iVar5,attributes,
                                       (size_t)channel_offset_list,in_stack_ffffffffffffff38,
                                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       CONCAT44(num_channels,in_stack_ffffffffffffff40));
              if (!bVar10) {
                uVar16 = uVar16 | 4;
              }
              pEVar12 = exr_image->tiles;
            }
            *(int *)((long)&pEVar12->offset_x + lVar18) = iVar3;
            *(int *)((long)&exr_image->tiles->offset_y + lVar18) = iVar4;
            *(int *)((long)&exr_image->tiles->level_x + lVar18) = iVar1;
            *(int *)((long)&exr_image->tiles->level_y + lVar18) = iVar2;
          }
        }
        else {
          uVar16 = uVar16 | 1;
        }
      }
      iVar17 = iVar17 + 1;
      lVar18 = lVar18 + 0x20;
    } while ((ulong)uVar15 << 5 != lVar18);
  }
  exr_image->num_channels = num_channels;
  exr_image->num_tiles = uVar15;
  if (err != (string *)0x0) {
    if ((uVar16 & 2) != 0) {
      std::__cxx11::string::append((char *)err);
    }
    if ((uVar16 & 4) != 0) {
      std::__cxx11::string::append((char *)err);
    }
  }
  return (uint)(uVar16 == 0) * 4 + -4;
}

Assistant:

static int DecodeTiledLevel(EXRImage* exr_image, const EXRHeader* exr_header,
  const OffsetData& offset_data,
  const std::vector<size_t>& channel_offset_list,
  int pixel_data_size,
  const unsigned char* head, const size_t size,
  std::string* err) {
  int num_channels = exr_header->num_channels;

  int level_index = LevelIndex(exr_image->level_x, exr_image->level_y, exr_header->tile_level_mode, offset_data.num_x_levels);
  int num_y_tiles = int(offset_data.offsets[size_t(level_index)].size());
  assert(num_y_tiles);
  int num_x_tiles = int(offset_data.offsets[size_t(level_index)][0].size());
  assert(num_x_tiles);
  int num_tiles = num_x_tiles * num_y_tiles;

  int err_code = TINYEXR_SUCCESS;

  enum {
    EF_SUCCESS = 0,
    EF_INVALID_DATA = 1,
    EF_INSUFFICIENT_DATA = 2,
    EF_FAILED_TO_DECODE = 4
  };
#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
  std::atomic<unsigned> error_flag(EF_SUCCESS);
#else
  unsigned error_flag(EF_SUCCESS);
#endif
  
  // Although the spec says : "...the data window is subdivided into an array of smaller rectangles...",
  // the IlmImf library allows the dimensions of the tile to be larger (or equal) than the dimensions of the data window.
#if 0
  if ((exr_header->tile_size_x > exr_image->width || exr_header->tile_size_y > exr_image->height) &&
    exr_image->level_x == 0 && exr_image->level_y == 0) {
    if (err) {
      (*err) += "Failed to decode tile data.\n";
    }
    err_code = TINYEXR_ERROR_INVALID_DATA;
  }
#endif
  exr_image->tiles = static_cast<EXRTile*>(
    calloc(sizeof(EXRTile), static_cast<size_t>(num_tiles)));

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
  std::vector<std::thread> workers;
  std::atomic<int> tile_count(0);

  int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
  if (num_threads > int(num_tiles)) {
    num_threads = int(num_tiles);
  }

  for (int t = 0; t < num_threads; t++) {
    workers.emplace_back(std::thread([&]()
      {
        int tile_idx = 0;
        while ((tile_idx = tile_count++) < num_tiles) {

#else
#if TINYEXR_USE_OPENMP
#pragma omp parallel for
#endif
  for (int tile_idx = 0; tile_idx < num_tiles; tile_idx++) {
#endif
    // Allocate memory for each tile.
    exr_image->tiles[tile_idx].images = tinyexr::AllocateImage(
      num_channels, exr_header->channels,
      exr_header->requested_pixel_types, exr_header->tile_size_x,
      exr_header->tile_size_y);

    int x_tile = tile_idx % num_x_tiles;
    int y_tile = tile_idx / num_x_tiles;
    // 16 byte: tile coordinates
    // 4 byte : data size
    // ~      : data(uncompressed or compressed)
    tinyexr::tinyexr_uint64 offset = offset_data.offsets[size_t(level_index)][size_t(y_tile)][size_t(x_tile)];
    if (offset + sizeof(int) * 5 > size) {
      // Insufficient data size.
      error_flag |= EF_INSUFFICIENT_DATA; 
      continue;
    }

    size_t data_size =
      size_t(size - (offset + sizeof(int) * 5));
    const unsigned char* data_ptr =
      reinterpret_cast<const unsigned char*>(head + offset);

    int tile_coordinates[4];
    memcpy(tile_coordinates, data_ptr, sizeof(int) * 4);
    tinyexr::swap4(&tile_coordinates[0]);
    tinyexr::swap4(&tile_coordinates[1]);
    tinyexr::swap4(&tile_coordinates[2]);
    tinyexr::swap4(&tile_coordinates[3]);

    if (tile_coordinates[2] != exr_image->level_x) {
      // Invalid data.
      error_flag |= EF_INVALID_DATA;
      continue;
    }
    if (tile_coordinates[3] != exr_image->level_y) {
      // Invalid data.
      error_flag |= EF_INVALID_DATA;
      continue;
    }

    int data_len;
    memcpy(&data_len, data_ptr + 16,
      sizeof(int));  // 16 = sizeof(tile_coordinates)
    tinyexr::swap4(&data_len);

    if (data_len < 2 || size_t(data_len) > data_size) {
      // Insufficient data size.
      error_flag |= EF_INSUFFICIENT_DATA;
      continue;
    }

    // Move to data addr: 20 = 16 + 4;
    data_ptr += 20;
    bool ret = tinyexr::DecodeTiledPixelData(
      exr_image->tiles[tile_idx].images,
      &(exr_image->tiles[tile_idx].width),
      &(exr_image->tiles[tile_idx].height),
      exr_header->requested_pixel_types, data_ptr,
      static_cast<size_t>(data_len), exr_header->compression_type,
      exr_header->line_order,
      exr_image->width, exr_image->height,
      tile_coordinates[0], tile_coordinates[1], exr_header->tile_size_x,
      exr_header->tile_size_y, static_cast<size_t>(pixel_data_size),
      static_cast<size_t>(exr_header->num_custom_attributes),
      exr_header->custom_attributes,
      static_cast<size_t>(exr_header->num_channels),
      exr_header->channels, channel_offset_list);

    if (!ret) {
      // Failed to decode tile data.
      error_flag |= EF_FAILED_TO_DECODE;
    }

    exr_image->tiles[tile_idx].offset_x = tile_coordinates[0];
    exr_image->tiles[tile_idx].offset_y = tile_coordinates[1];
    exr_image->tiles[tile_idx].level_x = tile_coordinates[2];
    exr_image->tiles[tile_idx].level_y = tile_coordinates[3];

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
  }  
        }));
    }  // num_thread loop

    for (auto& t : workers) {
      t.join();
    }

#else
  } // parallel for
#endif

  // Even in the event of an error, the reserved memory may be freed.
  exr_image->num_channels = num_channels;
  exr_image->num_tiles = static_cast<int>(num_tiles);

  if (error_flag)  err_code = TINYEXR_ERROR_INVALID_DATA;
  if (err) {
    if (error_flag & EF_INSUFFICIENT_DATA) {
      (*err) += "Insufficient data length.\n";
    }
    if (error_flag & EF_FAILED_TO_DECODE) {
      (*err) += "Failed to decode tile data.\n";
    }
  }
  return err_code;
}